

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall ast::Identifier::evaluate(Identifier *this)

{
  int iVar1;
  allocator local_41;
  string local_40;
  Value_type local_1c;
  Identifier *pIStack_18;
  Value_type symbol_type;
  Identifier *this_local;
  
  pIStack_18 = this;
  local_1c = Symbol::get_type(this->symbol);
  if (local_1c == UNDEFINED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Undefined symbol",&local_41);
    error_report(&(this->super_Expression).location,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    (this->super_Expression).type = INVALID;
    this_local._7_1_ = false;
  }
  else {
    (this->super_Expression).type = local_1c;
    if (local_1c == INVALID) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = Symbol::get_value(this->symbol);
      (this->super_Expression).value = iVar1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Identifier::evaluate()
{
	auto symbol_type = symbol->get_type();
	if (symbol_type == UNDEFINED) {
		error_report(&location, "Undefined symbol");
		type = INVALID;
		return false;
	}
	type = symbol_type;
	if (symbol_type == INVALID)
		return false;
	value = symbol->get_value();
	return true;
}